

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O2

void lodepng::lodepng_icc_cleanup(LodePNGICC *icc)

{
  lodepng_icc_curve_cleanup(icc->trc);
  lodepng_icc_curve_cleanup(icc->trc + 1);
  lodepng_icc_curve_cleanup(icc->trc + 2);
  return;
}

Assistant:

void lodepng_icc_cleanup(LodePNGICC* icc) {
  lodepng_icc_curve_cleanup(&icc->trc[0]);
  lodepng_icc_curve_cleanup(&icc->trc[1]);
  lodepng_icc_curve_cleanup(&icc->trc[2]);
}